

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O0

Type * LLVMBC::Type::getIntTy(LLVMContext *context,uint32_t width)

{
  bool bVar1;
  TypeID TVar2;
  uint32_t uVar3;
  Vector<Type_*> *this;
  reference ppTVar4;
  IntegerType *this_00;
  LLVMContext *local_58;
  LLVMContext *local_50;
  IntegerType *type;
  Type *type_1;
  iterator __end1;
  iterator __begin1;
  Vector<Type_*> *__range1;
  Vector<Type_*> *cache;
  LLVMContext *pLStack_18;
  uint32_t width_local;
  LLVMContext *context_local;
  
  cache._4_4_ = width;
  pLStack_18 = context;
  this = LLVMContext::get_type_cache(context);
  __end1 = std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::begin(this)
  ;
  type_1 = (Type *)std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::end
                             (this);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
                                *)&type_1);
    if (!bVar1) {
      local_58 = (LLVMContext *)
                 LLVMContext::construct<LLVMBC::IntegerType,LLVMBC::LLVMContext&,unsigned_int&>
                           (pLStack_18,pLStack_18,(uint *)((long)&cache + 4));
      local_50 = local_58;
      std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>::push_back
                (this,(value_type *)&local_58);
      return (Type *)local_50;
    }
    ppTVar4 = __gnu_cxx::
              __normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
              ::operator*(&__end1);
    type = (IntegerType *)*ppTVar4;
    TVar2 = getTypeID((Type *)type);
    if (TVar2 == IntegerTyID) {
      this_00 = cast<LLVMBC::IntegerType>(&type->super_Type);
      uVar3 = IntegerType::getBitWidth(this_00);
      if (uVar3 == cache._4_4_) {
        return &type->super_Type;
      }
    }
    __gnu_cxx::
    __normal_iterator<LLVMBC::Type_**,_std::vector<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

Type *Type::getIntTy(LLVMContext &context, uint32_t width)
{
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
		if (type->getTypeID() == TypeID::IntegerTyID && cast<IntegerType>(type)->getBitWidth() == width)
			return type;

	auto *type = context.construct<IntegerType>(context, width);
	cache.push_back(type);
	return type;
}